

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_39292::ParseDummyCommand::configureAttribute
          (ParseDummyCommand *this,ConfigureContext *param_1,StringRef name,StringRef value)

{
  undefined1 *puVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  pcVar3 = name.Data;
  pcVar4 = value.Data;
  iVar2 = (*(this->delegate->super_BuildFileDelegate)._vptr_BuildFileDelegate[0xd])();
  if ((char)iVar2 != '\0') {
    local_48 = &local_38;
    if (pcVar3 == (char *)0x0) {
      local_40 = 0;
      local_38 = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,pcVar3,pcVar3 + name.Length);
    }
    puVar1 = local_48;
    local_68 = &local_58;
    if (pcVar4 == (char *)0x0) {
      local_60 = 0;
      local_58 = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,pcVar4,pcVar4 + value.Length);
    }
    printf("  -- \'%s\': \'%s\'\n",puVar1,local_68);
    if (local_68 != &local_58) {
      operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
    }
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    }
  }
  return true;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext&, StringRef name,
                                  StringRef value) override {
    if (delegate.shouldShowOutput()) {
      printf("  -- '%s': '%s'\n", name.str().c_str(), value.str().c_str());
    }
    return true;
  }